

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O3

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateReduceLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  int iVar3;
  pointer pcVar4;
  long lVar5;
  bool bVar6;
  LogMessage *other;
  long *plVar7;
  undefined1 *puVar8;
  long *plVar9;
  Result *_result;
  string err;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  long *local_a8;
  long local_a0;
  long local_98;
  long lStack_90;
  undefined1 local_88 [56];
  string local_50;
  
  validateInputCount(__return_storage_ptr__,layer,1,1);
  bVar6 = Result::good(__return_storage_ptr__);
  if (!bVar6) {
    return __return_storage_ptr__;
  }
  pcVar4 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  validateOutputCount(__return_storage_ptr__,layer,1,1);
  bVar6 = Result::good(__return_storage_ptr__);
  if (!bVar6) {
    return __return_storage_ptr__;
  }
  pcVar4 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  if ((this->ndArrayInterpretation != true) ||
     ((layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_ < 1)) goto LAB_0033d798;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Reduce","");
  validateInputOutputRankEquality(__return_storage_ptr__,layer,&local_50,&this->blobNameToRank);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  bVar6 = Result::good(__return_storage_ptr__);
  if (!bVar6) {
    return __return_storage_ptr__;
  }
  pcVar4 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  if ((layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_88,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x358);
    other = google::protobuf::internal::LogMessage::operator<<
                      ((LogMessage *)local_88,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_a8,other);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_88);
  }
  iVar2 = *(int *)((long)((layer->inputtensor_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x24
                  );
  pcVar4 = local_88 + 0x10;
  local_88._8_8_ = (char *)0x0;
  local_88[0x10] = '\0';
  if (layer->_oneof_case_[0] == 0x118) {
    puVar8 = *(undefined1 **)&layer->layer_;
  }
  else {
    puVar8 = Specification::_ReduceLayerParams_default_instance_;
  }
  iVar3 = *(int *)&(((ConvolutionLayerParams *)puVar8)->kernelsize_).arena_or_elements_;
  bVar6 = true;
  local_88._0_8_ = pcVar4;
  switch(iVar3) {
  case 0:
    if (iVar2 < 3) {
LAB_0033d681:
      plVar7 = (long *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      lVar5 = *plVar7;
      std::__cxx11::string::_M_construct<char*>((string *)&local_e8,lVar5,plVar7[1] + lVar5);
      std::operator+(&local_c8,"Reduce layer \'",&local_e8);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_c8);
LAB_0033d6ca:
      plVar9 = plVar7 + 2;
      if ((long *)*plVar7 == plVar9) {
        local_98 = *plVar9;
        lStack_90 = plVar7[3];
        local_a8 = &local_98;
      }
      else {
        local_98 = *plVar9;
        local_a8 = (long *)*plVar7;
      }
      local_a0 = plVar7[1];
      *plVar7 = (long)plVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::__cxx11::string::operator=((string *)local_88,(string *)&local_a8);
      if (local_a8 != &local_98) {
        operator_delete(local_a8,local_98 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_88);
      bVar6 = false;
    }
    break;
  case 1:
    if (iVar2 < 2) goto LAB_0033d681;
    break;
  case 2:
  case 3:
  case 4:
    if (iVar2 < 1) goto LAB_0033d681;
    break;
  default:
    if (iVar3 == 0x7fffffff) {
      plVar7 = (long *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      lVar5 = *plVar7;
      std::__cxx11::string::_M_construct<char*>((string *)&local_e8,lVar5,plVar7[1] + lVar5);
      std::operator+(&local_c8,"Reduce layer: \'",&local_e8);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_c8);
      goto LAB_0033d6ca;
    }
  }
  if ((pointer)local_88._0_8_ != pcVar4) {
    operator_delete((void *)local_88._0_8_,CONCAT71(local_88._17_7_,local_88[0x10]) + 1);
  }
  if (!bVar6) {
    return __return_storage_ptr__;
  }
LAB_0033d798:
  Result::Result(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateReduceLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));

    if (ndArrayInterpretation && layer.inputtensor_size() > 0) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputRankEquality(layer, "Reduce", blobNameToRank));

        int rank = static_cast<int>(layer.inputtensor(0).rank());
        bool sufficientInputRank = true;
        std::string err;

        switch (layer.reduce().axis()) {
            case Specification::ReduceLayerParams::CHW:
                if (rank < 3) {sufficientInputRank = false;}
                break;
            case Specification::ReduceLayerParams::HW:
                if (rank < 2) {sufficientInputRank = false;}
                break;
            case Specification::ReduceLayerParams::H:
                if (rank < 1) {sufficientInputRank = false;}
                break;
            case Specification::ReduceLayerParams::W:
                if (rank < 1) {sufficientInputRank = false;}
                break;
            case Specification::ReduceLayerParams::C:
                if (rank < 1) {sufficientInputRank = false;}
                break;
            case CoreML::Specification::ReduceLayerParams_ReduceAxis_ReduceLayerParams_ReduceAxis_INT_MIN_SENTINEL_DO_NOT_USE_:
            case CoreML::Specification::ReduceLayerParams_ReduceAxis_ReduceLayerParams_ReduceAxis_INT_MAX_SENTINEL_DO_NOT_USE_:
                err = "Reduce layer: '" + std::string(layer.name()) + "': unknown value for parameter 'axis'.";
                return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
        if (!sufficientInputRank) {
            err = "Reduce layer '" + std::string(layer.name()) + "': input's rank is smaller than the dimensions provided in the axis parameter";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }
    return Result();
}